

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void crnlib::split_vectors<crnlib::vec<3u,float>>
               (vec<3U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<3U,_float> (*result) [2])

{
  undefined8 uVar1;
  uint uVar2;
  uint i_2;
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  undefined8 *puVar6;
  vec<3U,_float> *pvVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  undefined8 *puVar11;
  uint i_1;
  uint i;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint i_23;
  ulong uVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  double sum;
  float dist2;
  float fVar19;
  float fVar20;
  float dist2_2;
  float fVar21;
  float dist2_3;
  float fVar22;
  float fVar23;
  float fVar24;
  vec<3U,_float> axis;
  vec<3U,_float> centroid;
  vec<3U,_float> new_left_child;
  vec<3U,_float> result_8;
  vec<3U,_float> right_child;
  vec<3U,_float> left_child;
  vec<3U,_float> result_1;
  vec<3U,_float> new_right_child;
  vec<3U,_float> furthest;
  vec<3U,_float> opposite;
  double weightedDotProducts [64];
  vec<3U,_float> weightedVectors [64];
  undefined8 local_5f0;
  float local_5e8;
  undefined8 local_5e0;
  float local_5d8;
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4 [3];
  undefined8 local_5b8;
  float local_5b0;
  undefined8 local_5a8;
  float local_5a0;
  undefined8 local_598;
  ulong uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined4 local_578;
  float local_568 [4];
  undefined8 local_558;
  float local_550;
  undefined8 local_548;
  float local_540;
  double adStack_538 [64];
  undefined8 local_338;
  undefined4 local_330 [192];
  
  local_5d8 = 0.0;
  local_5e0 = 0;
  uVar15 = (ulong)size;
  dVar17 = 0.0;
  dVar18 = 0.0;
  if (size == 0) {
    local_5e0._4_4_ = 0.0;
    local_5e0._0_4_ = 0.0;
    fVar16 = 0.0;
  }
  else {
    puVar6 = &local_338;
    uVar8 = 0;
    uVar4 = 0;
    pvVar7 = *vectors;
    do {
      uVar2 = (*weights)[uVar8];
      fVar16 = (float)uVar2;
      lVar12 = 0;
      do {
        *(float *)((long)&local_598 + lVar12 * 4) =
             ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar12] * fVar16;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_330[uVar8 * 3] = (float)uStack_590;
      *(undefined8 *)((long)&local_338 + uVar8 * 0xc) = local_598;
      lVar12 = 0;
      do {
        *(float *)((long)&local_5e0 + lVar12 * 4) =
             *(float *)((long)puVar6 + lVar12 * 4) + *(float *)((long)&local_5e0 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      fVar19 = (*vectors)[uVar8].m_s[0];
      uVar1 = *(undefined8 *)((*vectors)[uVar8].m_s + 1);
      fVar20 = (float)uVar1;
      fVar21 = (float)((ulong)uVar1 >> 0x20);
      uVar4 = uVar4 + uVar2;
      dVar17 = (double)((fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20) * fVar16);
      adStack_538[uVar8] = dVar17;
      dVar18 = dVar18 + dVar17;
      uVar8 = uVar8 + 1;
      pvVar7 = pvVar7 + 1;
      puVar6 = (undefined8 *)((long)puVar6 + 0xc);
    } while (uVar8 != uVar15);
    fVar16 = (float)uVar4;
    dVar17 = dVar18;
  }
  fVar21 = (float)local_5e0 * (float)local_5e0;
  fVar20 = local_5e0._4_4_ * local_5e0._4_4_;
  fVar19 = local_5d8 * local_5d8;
  lVar12 = 0;
  do {
    *(float *)((long)&local_5e0 + lVar12 * 4) =
         *(float *)((long)&local_5e0 + lVar12 * 4) * (1.0 / fVar16);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  (*result)[1].m_s[2] = local_5d8;
  *(undefined8 *)(*result)[1].m_s = local_5e0;
  *(undefined8 *)(*result)[0].m_s = local_5e0;
  (*result)[0].m_s[2] = local_5d8;
  if ((size != 1) && (0.0 < (float)(dVar17 - (double)((fVar19 + fVar20 + fVar21) / fVar16)))) {
    if (size != 0) {
      fVar19 = -1.0;
      uVar4 = 0;
      pvVar7 = *vectors;
      do {
        fVar20 = 0.0;
        lVar12 = 0;
        do {
          fVar21 = ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar12] -
                   *(float *)((long)&local_5e0 + lVar12 * 4);
          fVar20 = fVar20 + fVar21 * fVar21;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        if (fVar19 < fVar20) {
          local_550 = (*vectors)[uVar4].m_s[2];
          local_558 = *(undefined8 *)(*vectors)[uVar4].m_s;
          fVar19 = fVar20;
        }
        uVar4 = uVar4 + 1;
        pvVar7 = pvVar7 + 1;
      } while (uVar4 != uVar15);
      if (size != 0) {
        fVar19 = -1.0;
        uVar4 = 0;
        pvVar7 = *vectors;
        do {
          fVar20 = 0.0;
          lVar12 = 0;
          do {
            fVar21 = ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar12] -
                     *(float *)((long)&local_558 + lVar12 * 4);
            fVar20 = fVar20 + fVar21 * fVar21;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          if (fVar19 < fVar20) {
            local_540 = (*vectors)[uVar4].m_s[2];
            local_548 = *(undefined8 *)(*vectors)[uVar4].m_s;
            fVar19 = fVar20;
          }
          uVar4 = uVar4 + 1;
          pvVar7 = pvVar7 + 1;
        } while (uVar4 != uVar15);
      }
    }
    lVar12 = 0;
    do {
      *(float *)((long)&local_598 + lVar12 * 4) =
           *(float *)((long)&local_558 + lVar12 * 4) + *(float *)((long)&local_5e0 + lVar12 * 4);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar12 = 0;
    do {
      *(float *)((long)&local_5a8 + lVar12 * 4) = *(float *)((long)&local_598 + lVar12 * 4) * 0.5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar12 = 0;
    do {
      *(float *)((long)&local_598 + lVar12 * 4) =
           *(float *)((long)&local_548 + lVar12 * 4) + *(float *)((long)&local_5e0 + lVar12 * 4);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar12 = 0;
    do {
      *(float *)((long)&local_5b8 + lVar12 * 4) = *(float *)((long)&local_598 + lVar12 * 4) * 0.5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    if (2 < size) {
      local_588 = 0;
      uStack_580 = 0;
      local_598 = 0;
      uStack_590 = 0;
      local_578 = 0;
      uVar4 = 0;
      pvVar7 = *vectors;
      do {
        lVar12 = 0;
        do {
          *(float *)((long)&local_5f0 + lVar12 * 4) =
               ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar12] -
               *(float *)((long)&local_5e0 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        uVar2 = (*weights)[uVar4];
        lVar12 = 0;
        do {
          *(float *)((long)&local_5d0 + lVar12 * 4) =
               *(float *)((long)&local_5f0 + lVar12 * 4) * (float)uVar2;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        puVar6 = &local_5d0;
        puVar11 = &local_598;
        do {
          fVar19 = *(float *)((long)&local_5f0 + lVar12 * 4);
          lVar13 = -3;
          do {
            *(float *)((long)puVar11 + lVar13 * 4 + 0xc) =
                 *(float *)((long)puVar6 + lVar13 * 4 + 0xc) * fVar19 +
                 *(float *)((long)puVar11 + lVar13 * 4 + 0xc);
            lVar13 = lVar13 + 1;
          } while (lVar12 + lVar13 != 0);
          lVar12 = lVar12 + 1;
          puVar11 = puVar11 + 2;
          puVar6 = (undefined8 *)((long)puVar6 + 4);
        } while (lVar12 != 3);
        uVar4 = uVar4 + 1;
        pvVar7 = pvVar7 + 1;
      } while (uVar4 != uVar15);
      pfVar5 = (float *)&local_598;
      lVar12 = 0x24;
      lVar13 = 0;
      do {
        lVar9 = 0;
        pfVar10 = pfVar5;
        do {
          fVar19 = *pfVar10;
          *pfVar10 = fVar19 / fVar16;
          *(float *)((long)pfVar5 + lVar9) = fVar19 / fVar16;
          pfVar10 = pfVar10 + 1;
          lVar9 = lVar9 + 0xc;
        } while (lVar12 != lVar9);
        lVar13 = lVar13 + 1;
        pfVar5 = pfVar5 + 4;
        lVar12 = lVar12 + -0xc;
      } while (lVar13 != 3);
      local_5f0 = 0x3f8000003f800000;
      local_5e8 = 1.0;
      iVar3 = 0;
      do {
        lVar12 = 0;
        fVar16 = 0.0;
        puVar6 = &local_598;
        do {
          fVar19 = 0.0;
          lVar13 = 0;
          do {
            fVar19 = fVar19 + *(float *)((long)&local_5f0 + lVar13 * 4) *
                              *(float *)((long)puVar6 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          *(float *)((long)&local_5d0 + lVar12 * 4) = fVar19;
          fVar20 = fVar16;
          if (fVar16 <= fVar19) {
            fVar20 = fVar19;
          }
          fVar16 = fVar19;
          if (lVar12 != 0) {
            fVar16 = fVar20;
          }
          lVar12 = lVar12 + 1;
          puVar6 = (undefined8 *)((long)puVar6 + 0xc);
        } while (lVar12 != 3);
        if ((fVar20 != 0.0) || (NAN(fVar20))) {
          lVar12 = 0;
          do {
            *(float *)((long)&local_5d0 + lVar12 * 4) =
                 *(float *)((long)&local_5d0 + lVar12 * 4) * (1.0 / fVar20);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
        }
        local_5e8 = (float)local_5c8;
        local_5f0 = local_5d0;
        uVar1 = local_5f0;
        iVar3 = iVar3 + 1;
      } while (iVar3 != 10);
      local_5f0._0_4_ = (float)local_5d0;
      dVar18 = (double)((float)local_5f0 * (float)local_5f0);
      lVar12 = 1;
      do {
        fVar16 = *(float *)((long)&local_5f0 + lVar12 * 4);
        dVar18 = dVar18 + (double)(fVar16 * fVar16);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        local_5f0 = uVar1;
        if (dVar18 < 0.0) {
          dVar18 = sqrt(dVar18);
        }
        else {
          dVar18 = SQRT(dVar18);
        }
        lVar12 = 0;
        do {
          *(float *)((long)&local_5f0 + lVar12 * 4) =
               *(float *)((long)&local_5f0 + lVar12 * 4) * (float)(1.0 / dVar18);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
      dVar17 = 0.0;
      uVar4 = 0;
      local_5c8 = 0;
      local_5d0 = 0;
      local_568[2] = 0.0;
      local_568[0] = 0.0;
      local_568[1] = 0.0;
      puVar6 = &local_338;
      dVar18 = 0.0;
      pvVar7 = *vectors;
      do {
        uVar2 = (*weights)[uVar4];
        lVar12 = 0;
        do {
          local_5c4[lVar12] =
               ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar12] -
               *(float *)((long)&local_5e0 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        fVar16 = local_5c4[0] * (float)local_5f0;
        lVar12 = 1;
        do {
          fVar16 = fVar16 + local_5c4[lVar12] * *(float *)((long)&local_5f0 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        if (0.0 <= fVar16) {
          do {
            local_568[lVar12] = *(float *)((long)puVar6 + lVar12 * 4) + local_568[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          dVar17 = dVar17 + (double)uVar2;
        }
        else {
          do {
            *(float *)((long)&local_5d0 + lVar12 * 4) =
                 *(float *)((long)puVar6 + lVar12 * 4) + *(float *)((long)&local_5d0 + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          dVar18 = dVar18 + (double)uVar2;
        }
        uVar4 = uVar4 + 1;
        pvVar7 = pvVar7 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0xc);
      } while (uVar4 != uVar15);
      if ((0.0 < dVar18) && (0.0 < dVar17)) {
        lVar12 = 0;
        do {
          local_5c4[lVar12] = *(float *)((long)&local_5d0 + lVar12 * 4) * (float)(1.0 / dVar18);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_5a0 = local_5c4[2];
        lVar12 = 0;
        do {
          local_5c4[lVar12] = local_568[lVar12] * (float)(1.0 / dVar17);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_5b0 = local_5c4[2];
      }
    }
    iVar3 = 0;
    fVar16 = 1e+10;
    do {
      uStack_590 = uStack_590 & 0xffffffff00000000;
      local_598 = 0;
      local_5e8 = 0.0;
      local_5f0 = 0;
      if (size == 0) {
        return;
      }
      dVar18 = 0.0;
      uVar14 = 0;
      dVar17 = 0.0;
      uVar4 = 0;
      uVar8 = 0;
      puVar6 = &local_338;
      pvVar7 = *vectors;
      do {
        fVar19 = 0.0;
        lVar12 = 0;
        do {
          fVar20 = *(float *)((long)&local_5a8 + lVar12 * 4) -
                   ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar12];
          fVar19 = fVar19 + fVar20 * fVar20;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        fVar20 = 0.0;
        lVar12 = 0;
        do {
          fVar21 = *(float *)((long)&local_5b8 + lVar12 * 4) -
                   ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar12];
          fVar20 = fVar20 + fVar21 * fVar21;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        if (fVar20 <= fVar19) {
          do {
            *(float *)((long)&local_5f0 + lVar12 * 4) =
                 *(float *)((long)puVar6 + lVar12 * 4) + *(float *)((long)&local_5f0 + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          dVar18 = dVar18 + adStack_538[uVar14];
          uVar4 = uVar4 + (*weights)[uVar14];
        }
        else {
          do {
            *(float *)((long)&local_598 + lVar12 * 4) =
                 *(float *)((long)puVar6 + lVar12 * 4) + *(float *)((long)&local_598 + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          dVar17 = dVar17 + adStack_538[uVar14];
          uVar8 = uVar8 + (*weights)[uVar14];
        }
        uVar14 = uVar14 + 1;
        pvVar7 = pvVar7 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0xc);
      } while (uVar14 != uVar15);
      if (uVar8 == 0) {
        return;
      }
      if (uVar4 == 0) {
        return;
      }
      fVar19 = (float)local_598 * (float)local_598;
      fVar23 = local_598._4_4_ * local_598._4_4_;
      fVar20 = (float)uStack_590 * (float)uStack_590;
      fVar21 = (float)local_5f0 * (float)local_5f0;
      fVar24 = local_5f0._4_4_ * local_5f0._4_4_;
      fVar22 = local_5e8 * local_5e8;
      lVar12 = 0;
      do {
        *(float *)((long)&local_598 + lVar12 * 4) =
             *(float *)((long)&local_598 + lVar12 * 4) * (1.0 / (float)uVar8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar12 = 0;
      do {
        *(float *)((long)&local_5f0 + lVar12 * 4) =
             *(float *)((long)&local_5f0 + lVar12 * 4) * (1.0 / (float)uVar4);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_5a0 = (float)uStack_590;
      local_5a8 = local_598;
      local_5b8 = local_5f0;
      local_5b0 = local_5e8;
      fVar19 = (float)(dVar17 - (double)((fVar20 + fVar23 + fVar19) / (float)uVar8)) +
               (float)(dVar18 - (double)((fVar22 + fVar24 + fVar21) / (float)uVar4));
    } while (((1e-05 <= fVar19) && (1e-05 <= (fVar16 - fVar19) / fVar19)) &&
            (iVar3 = iVar3 + 1, fVar16 = fVar19, iVar3 != 0x400));
    (*result)[0].m_s[2] = (float)uStack_590;
    *(undefined8 *)(*result)[0].m_s = local_598;
    (*result)[1].m_s[2] = local_5e8;
    *(undefined8 *)(*result)[1].m_s = local_5f0;
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2]) {
  VectorType weightedVectors[64];
  double weightedDotProducts[64];
  VectorType centroid(cClear);
  uint64 total_weight = 0;
  double ttsum = 0.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    const uint weight = weights[i];
    weightedVectors[i] = v * (float)weight;
    centroid += weightedVectors[i];
    total_weight += weight;
    weightedDotProducts[i] = v.dot(v) * weight;
    ttsum += weightedDotProducts[i];
  }
  float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
  centroid *= (1.0f / total_weight);
  result[0] = result[1] = centroid;
  if (variance <= 0.0f || size == 1)
    return;
  VectorType furthest;
  double furthest_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(centroid);
    if (dist > furthest_dist) {
      furthest_dist = dist;
      furthest = v;
    }
  }
  VectorType opposite;
  double opposite_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(furthest);
    if (dist > opposite_dist) {
      opposite_dist = dist;
      opposite = v;
    }
  }
  VectorType left_child((furthest + centroid) * .5f);
  VectorType right_child((opposite + centroid) * .5f);
  if (size > 2) {
    const uint N = VectorType::num_elements;
    matrix<N, N, float> covar;
    covar.clear();
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i] - centroid;
      const VectorType w = v * (float)weights[i];
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
      }
    }
    float divider = (float)total_weight;
    for (uint x = 0; x < N; x++) {
      for (uint y = x; y < N; y++) {
        covar[x][y] /= divider;
        covar[y][x] = covar[x][y];
      }
    }
    VectorType axis(1.0f);
    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;
      double max_sum = 0;
      for (uint i = 0; i < N; i++) {
        double sum = 0;
        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];
        x[i] = (float)sum;
        max_sum = i ? math::maximum(max_sum, sum) : sum;
      }
      if (max_sum != 0.0f)
        x *= (float)(1.0f / max_sum);
      axis = x;
    }
    axis.normalize();
    VectorType new_left_child(0.0f);
    VectorType new_right_child(0.0f);
    double left_weight = 0.0f;
    double right_weight = 0.0f;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      const float weight = (float)weights[i];
      double t = (v - centroid) * axis;
      if (t < 0.0f) {
        new_left_child += weightedVectors[i];
        left_weight += weight;
      } else {
        new_right_child += weightedVectors[i];
        right_weight += weight;
      }
    }
    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child = new_left_child * (float)(1.0f / left_weight);
      right_child = new_right_child * (float)(1.0f / right_weight);
    }
  }
  uint64 left_weight = 0;
  uint64 right_weight = 0;
  float prev_total_variance = 1e+10f;
  float left_variance = 0.0f;
  float right_variance = 0.0f;
  const uint cMaxLoops = 1024;
  for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
    VectorType new_left_child(cClear);
    VectorType new_right_child(cClear);
    double left_ttsum = 0.0f;
    double right_ttsum = 0.0f;
    left_weight = 0;
    right_weight = 0;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      if (left_dist2 < right_dist2) {
        new_left_child += weightedVectors[i];
        left_ttsum += weightedDotProducts[i];
        left_weight += weights[i];
      } else {
        new_right_child += weightedVectors[i];
        right_ttsum += weightedDotProducts[i];
        right_weight += weights[i];
      }
    }
    if ((!left_weight) || (!right_weight))
      return;
    left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
    right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
    new_left_child *= (1.0f / left_weight);
    new_right_child *= (1.0f / right_weight);
    left_child = new_left_child;
    right_child = new_right_child;
    float total_variance = left_variance + right_variance;
    if (total_variance < .00001f)
      break;
    if (((prev_total_variance - total_variance) / total_variance) < .00001f)
      break;
    prev_total_variance = total_variance;
  }
  result[0] = left_child;
  result[1] = right_child;
}